

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::
MeshEdgebreakerEncoderImpl(MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this)

{
  MeshEdgebreakerEncoderImplInterface *in_RDI;
  MeshAttributeIndicesEncodingData *in_stack_ffffffffffffff80;
  MeshEdgebreakerTraversalEncoder *this_00;
  
  MeshEdgebreakerEncoderImplInterface::MeshEdgebreakerEncoderImplInterface(in_RDI);
  in_RDI->_vptr_MeshEdgebreakerEncoderImplInterface =
       (_func_int **)&PTR__MeshEdgebreakerEncoderImpl_003298a8;
  in_RDI[1]._vptr_MeshEdgebreakerEncoderImplInterface = (_func_int **)0x0;
  in_RDI[2]._vptr_MeshEdgebreakerEncoderImplInterface = (_func_int **)0x0;
  std::unique_ptr<draco::CornerTable,std::default_delete<draco::CornerTable>>::
  unique_ptr<std::default_delete<draco::CornerTable>,void>
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             in_stack_ffffffffffffff80);
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::vector((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            *)0x193b61);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x193b74);
  MeshAttributeIndicesEncodingData::MeshAttributeIndicesEncodingData(in_stack_ffffffffffffff80);
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::vector((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            *)0x193b9e);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x193bb4);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x193bca);
  this_00 = (MeshEdgebreakerTraversalEncoder *)(in_RDI + 0x1f);
  std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::vector
            ((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
              *)0x193be0);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x193bf6);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x193c0c);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x193c22);
  *(undefined4 *)&in_RDI[0x31]._vptr_MeshEdgebreakerEncoderImplInterface = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x31]._vptr_MeshEdgebreakerEncoderImplInterface + 4) = 0;
  std::
  vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
  ::vector((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
            *)0x193c4c);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x193c62);
  MeshEdgebreakerTraversalEncoder::MeshEdgebreakerTraversalEncoder(this_00);
  *(undefined1 *)&in_RDI[0x4b]._vptr_MeshEdgebreakerEncoderImplInterface = 0;
  return;
}

Assistant:

MeshEdgebreakerEncoderImpl<TraversalEncoder>::MeshEdgebreakerEncoderImpl()
    : encoder_(nullptr),
      mesh_(nullptr),
      last_encoded_symbol_id_(-1),
      num_split_symbols_(0),
      use_single_connectivity_(false) {}